

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_read_ascii_image(znzFile fp,char *fname,int flen,int read_data)

{
  int iVar1;
  size_t sVar2;
  char local_68 [8];
  char lfunc [25];
  char *sbuf;
  int rv;
  int remain;
  int txt_size;
  int slen;
  nifti_image *nim;
  int read_data_local;
  int flen_local;
  char *fname_local;
  znzFile fp_local;
  
  sbuf._0_4_ = 0;
  builtin_strncpy(local_68,"nifti_re",8);
  builtin_strncpy(lfunc,"ad_ascii_image",0xf);
  lfunc[0xf] = '\0';
  lfunc[0x10] = '\0';
  nim._0_4_ = read_data;
  nim._4_4_ = flen;
  _read_data_local = fname;
  fname_local = (char *)fp;
  iVar1 = nifti_is_gzfile(fname);
  if (iVar1 == 0) {
    remain = nim._4_4_;
    if (1 < g_opts.debug) {
      fprintf(_stderr,"-d %s: have ASCII NIFTI file of size %d\n",_read_data_local,(ulong)nim._4_4_)
      ;
    }
    if (0xfffa < remain) {
      remain = 0xfffa;
    }
    register0x00000000 = (char *)calloc(1,(long)(remain + 1));
    if (register0x00000000 == (char *)0x0) {
      fprintf(_stderr,"** %s: failed to alloc %d bytes for sbuf",local_68,0xfffa);
      free(_read_data_local);
      Xznzclose((znzFile *)&fname_local);
      fp_local = (znzFile)0x0;
    }
    else {
      znzread(register0x00000000,1,(long)remain,(znzFile)fname_local);
      _txt_size = nifti_image_from_ascii(stack0xffffffffffffffb8,&rv);
      free(stack0xffffffffffffffb8);
      if (_txt_size == (nifti_image *)0x0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_68,"failed nifti_image_from_ascii()",
                _read_data_local);
        free(_read_data_local);
        Xznzclose((znzFile *)&fname_local);
        fp_local = (znzFile)0x0;
      }
      else {
        _txt_size->nifti_type = 3;
        iVar1 = nim._4_4_ - rv;
        sVar2 = nifti_get_volsize(_txt_size);
        iVar1 = iVar1 - (int)sVar2;
        if (4 < iVar1) {
          znzseek((znzFile)fname_local,(long)rv,0);
          nifti_read_extensions(_txt_size,(znzFile)fname_local,iVar1);
        }
        free(_read_data_local);
        Xznzclose((znzFile *)&fname_local);
        _txt_size->iname_offset = -1;
        if ((int)nim == 0) {
          _txt_size->data = (void *)0x0;
        }
        else {
          sbuf._0_4_ = nifti_image_load(_txt_size);
        }
        if (((int)nim == 0) || ((int)sbuf == 0)) {
          fp_local = (znzFile)_txt_size;
        }
        else {
          if (1 < g_opts.debug) {
            fprintf(_stderr,"-d failed image_load, free nifti image struct\n");
          }
          free(_txt_size);
          fp_local = (znzFile)0x0;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_68,
            "compression not supported for file type NIFTI_FTYPE_ASCII",_read_data_local);
    free(_read_data_local);
    Xznzclose((znzFile *)&fname_local);
    fp_local = (znzFile)0x0;
  }
  return (nifti_image *)fp_local;
}

Assistant:

nifti_image * nifti_read_ascii_image(znzFile fp, char *fname, int flen,
                                     int read_data)
{
   nifti_image * nim;
   int           slen, txt_size, remain, rv = 0;
   char        * sbuf, lfunc[25] = { "nifti_read_ascii_image" };

   if( nifti_is_gzfile(fname) ){
     LNI_FERR(lfunc,"compression not supported for file type NIFTI_FTYPE_ASCII",
              fname);
     free(fname);  znzclose(fp);  return NULL;
   }
   slen = flen;  /* slen will be our buffer length */

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: have ASCII NIFTI file of size %d\n",fname,slen);

   if( slen > 65530 ) slen = 65530 ;
   sbuf = (char *)calloc(sizeof(char),slen+1) ;
   if( !sbuf ){
      fprintf(stderr,"** %s: failed to alloc %d bytes for sbuf",lfunc,65530);
      free(fname);  znzclose(fp);  return NULL;
   }
   znzread( sbuf , 1 , slen , fp ) ;
   nim = nifti_image_from_ascii( sbuf, &txt_size ) ; free( sbuf ) ;
   if( nim == NULL ){
      LNI_FERR(lfunc,"failed nifti_image_from_ascii()",fname);
      free(fname);  znzclose(fp);  return NULL;
   }
   nim->nifti_type = NIFTI_FTYPE_ASCII ;

   /* compute remaining space for extensions */
   remain = flen - txt_size - (int)nifti_get_volsize(nim);
   if( remain > 4 ){
      /* read extensions (reposition file pointer, first) */
      znzseek(fp, txt_size, SEEK_SET);
      (void) nifti_read_extensions(nim, fp, remain);
   }

   free(fname);
   znzclose( fp ) ;

   nim->iname_offset = -1 ;  /* check from the end of the file */

   if( read_data ) rv = nifti_image_load( nim ) ;
   else            nim->data = NULL ;

   /* check for nifti_image_load() failure, maybe bail out */
   if( read_data && rv != 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d failed image_load, free nifti image struct\n");
      free(nim);
      return NULL;
   }

   return nim ;
}